

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O0

int getopt_next(getopt_context_t *ctx)

{
  char *pcVar1;
  int iVar2;
  getopt_option_t *opt_00;
  size_t sVar3;
  char *pcVar4;
  char *next_token;
  uint name_len;
  getopt_option_t *opt_1;
  char *check_option;
  int i_1;
  getopt_option_t *opt;
  char *pcStack_30;
  int i;
  char *found_arg;
  getopt_option_t *found_opt;
  char *curr_token;
  getopt_context_t *ctx_local;
  
  if (ctx->current_index == ctx->argc) {
    return -1;
  }
  ctx->current_opt_arg = (char *)0x0;
  pcVar1 = ctx->argv[ctx->current_index];
  ctx->current_index = ctx->current_index + 1;
  if ((*pcVar1 != '\0') && (*pcVar1 != '-')) {
    ctx->current_opt_arg = pcVar1;
    return 0x2b;
  }
  found_arg = (char *)0x0;
  pcStack_30 = (char *)0x0;
  if (((pcVar1[1] == '\0') || (pcVar1[1] == '-')) || (pcVar1[2] != '\0')) {
    if ((pcVar1[1] != '-') || (pcVar1[2] == '\0')) {
      ctx->current_opt_arg = pcVar1;
      return 0x21;
    }
    for (check_option._4_4_ = 0; opt_00 = (getopt_option_t *)found_arg,
        check_option._4_4_ < ctx->num_opts; check_option._4_4_ = check_option._4_4_ + 1) {
      opt_00 = ctx->opts + check_option._4_4_;
      if (opt_00->name != (char *)0x0) {
        sVar3 = strlen(opt_00->name);
        iVar2 = str_case_cmp_len(opt_00->name,pcVar1 + 2,(uint)sVar3);
        if (iVar2 == 0) {
          pcVar4 = pcVar1 + 2 + (sVar3 & 0xffffffff);
          iVar2 = getopt_opt_might_have_arg(opt_00);
          if (iVar2 == 0) break;
          if (*pcVar4 == '\0') {
            if (ctx->current_index < ctx->argc) {
              pcVar4 = ctx->argv[ctx->current_index];
              if (*pcVar4 == '=') {
                ctx->current_index = ctx->current_index + 1;
                if (pcVar4[1] == '\0') {
                  if (ctx->current_index < ctx->argc) {
                    iVar2 = ctx->current_index;
                    ctx->current_index = iVar2 + 1;
                    pcStack_30 = ctx->argv[iVar2];
                  }
                }
                else {
                  pcStack_30 = pcVar4 + 1;
                }
              }
              else if (*pcVar4 != '-') {
                ctx->current_index = ctx->current_index + 1;
                pcStack_30 = pcVar4;
              }
            }
            break;
          }
          if (*pcVar4 == '=') {
            if (pcVar4[1] == '\0') {
              if (ctx->current_index < ctx->argc) {
                iVar2 = ctx->current_index;
                ctx->current_index = iVar2 + 1;
                pcStack_30 = ctx->argv[iVar2];
              }
            }
            else {
              pcStack_30 = pcVar4 + 1;
            }
            break;
          }
        }
      }
    }
  }
  else {
    for (opt._4_4_ = 0; opt_00 = (getopt_option_t *)found_arg, opt._4_4_ < ctx->num_opts;
        opt._4_4_ = opt._4_4_ + 1) {
      opt_00 = ctx->opts + opt._4_4_;
      if (opt_00->name_short == (int)pcVar1[1]) {
        if (((ctx->current_index != ctx->argc) && (*ctx->argv[ctx->current_index] != '-')) &&
           (iVar2 = getopt_opt_might_have_arg(opt_00), iVar2 != 0)) {
          pcStack_30 = ctx->argv[ctx->current_index];
          ctx->current_index = ctx->current_index + 1;
        }
        break;
      }
    }
  }
  found_arg = (char *)opt_00;
  if (found_arg == (char *)0x0) {
    ctx->current_opt_arg = pcVar1;
    return 0x3f;
  }
  if (pcStack_30 == (char *)0x0) {
    switch(*(undefined4 *)(found_arg + 0xc)) {
    case 0:
    case 2:
    case 4:
    case 6:
      ctx_local._4_4_ = *(int *)(found_arg + 0x18);
      break;
    case 1:
    case 3:
    case 5:
      ctx->current_opt_arg = *(char **)found_arg;
      ctx_local._4_4_ = 0x21;
      break;
    case 7:
      **(undefined4 **)(found_arg + 0x10) = *(undefined4 *)(found_arg + 0x18);
      ctx_local._4_4_ = 0;
      break;
    case 8:
      **(uint **)(found_arg + 0x10) = *(uint *)(found_arg + 0x18) & **(uint **)(found_arg + 0x10);
      ctx_local._4_4_ = 0;
      break;
    case 9:
      **(uint **)(found_arg + 0x10) = *(uint *)(found_arg + 0x18) | **(uint **)(found_arg + 0x10);
      ctx_local._4_4_ = 0;
      break;
    default:
switchD_00172aeb_default:
      ctx_local._4_4_ = -1;
    }
  }
  else {
    ctx->current_opt_arg = pcStack_30;
    iVar2 = *(int *)(found_arg + 0xc);
    if (iVar2 != 0) {
      if (iVar2 - 1U < 2) {
        return *(int *)(found_arg + 0x18);
      }
      if (iVar2 - 3U < 4) {
        iVar2 = getopt_read_value(ctx,(getopt_option_t *)found_arg);
        return iVar2;
      }
      if (2 < iVar2 - 7U) goto switchD_00172aeb_default;
    }
    ctx->current_opt_arg = (char *)0x0;
    ctx_local._4_4_ = 0x2b;
  }
  return ctx_local._4_4_;
}

Assistant:

int getopt_next( getopt_context_t* ctx )
{
	/* are all options processed? */
	if(ctx->current_index == ctx->argc )
		return -1;

	/* reset opt-arg */
	ctx->current_opt_arg = 0x0;

	const char* curr_token = ctx->argv[ ctx->current_index ];
	
	/* this token has been processed! */
	ctx->current_index++;

	/* check if item is no option */
	if( curr_token[0] && curr_token[0] != '-' )
	{
		ctx->current_opt_arg = curr_token;
		return '+'; /* return '+' as identifier for no option! */
	}
	
	const getopt_option_t* found_opt = 0x0;
	const char* found_arg = 0x0;

	/* short opt */
	if( curr_token[1] != '\0' && curr_token[1] != '-' && curr_token[2] == '\0' )
	{
		int i = 0;
		for( ; i < ctx->num_opts; i++ )
		{
			const getopt_option_t* opt = ctx->opts + i;

			if( opt->name_short == curr_token[1] )
			{
				found_opt = opt;

				/* if there is an value when: - current_index < argc and value in argv[current_index] do not start with '-' */
				if( ( ( ctx->current_index != ctx->argc) && ( ctx->argv[ctx->current_index][0] != '-' ) ) && 
					  getopt_opt_might_have_arg(opt) )
				{
					found_arg = ctx->argv[ctx->current_index];
					ctx->current_index++; /* next token has been processed aswell! */
				}
				break;
			}
		}
	}
	/* long opt */
	else if(curr_token[1] == '-' && curr_token[2] != '\0')
	{
		int i = 0;
		for( ; i < ctx->num_opts; i++ )
		{
			const char* check_option = curr_token + 2;

			const getopt_option_t* opt = ctx->opts + i;

			if(!opt->name)
				continue;

			unsigned int name_len = (unsigned int)strlen( opt->name );

			if( str_case_cmp_len( opt->name, check_option, name_len ) == 0 )
			{
				check_option += name_len;

				/* find arg if there is any */
				if(getopt_opt_might_have_arg(opt))
				{
					switch( *check_option )
					{
						case '\0':
						{
							if( ctx->current_index < ctx->argc ) /* are there more tokens that can contain the '='? */
							{
								const char* next_token = ctx->argv[ ctx->current_index ];
								if( next_token[0] == '=' )
								{
									ctx->current_index++; /* next token has been processed aswell! */

									if( next_token[1] != '\0' ) /* does this token contain the arg-value? */
										found_arg = next_token + 1;
									else if( ctx->current_index < ctx->argc )
										found_arg = ctx->argv[ ctx->current_index++ ]; /* next token has been processed aswell! */
								}
								else if( next_token[0] != '-' )
								{
									ctx->current_index++; /* next token has been processed aswell! */
									found_arg = next_token;
								}
							}
						}
						break;
						case '=':
							if( check_option[1] != '\0' )
								found_arg = check_option + 1;
							else if( ctx->current_index < ctx->argc )
								found_arg = ctx->argv[ ctx->current_index++ ]; /* next token has been processed aswell! */
						break;
						default:
							/* not found, matched for example --test but it was --testing*/
							continue;
					}
				}

				found_opt = opt;
				break;
			}
		}
	}
	/* malformed opt "-", "-xyz" or "--" */
	else
	{
		ctx->current_opt_arg = curr_token;
		return '!';
	}

	/* found no matching option! */
	if(found_opt == 0x0)
	{
		ctx->current_opt_arg = curr_token;
		return '?';
	}

	if(found_arg != 0x0)
	{
		ctx->current_opt_arg = found_arg;

		switch(found_opt->type)
		{
			case GETOPT_OPTION_TYPE_FLAG_SET:
			case GETOPT_OPTION_TYPE_FLAG_AND:
			case GETOPT_OPTION_TYPE_FLAG_OR:
			case GETOPT_OPTION_TYPE_NO_ARG:
				/* these types should have no argument, usage error! */
				ctx->current_opt_arg = 0x0;
				return '+';

			case GETOPT_OPTION_TYPE_OPTIONAL:
			case GETOPT_OPTION_TYPE_REQUIRED:
				return found_opt->value;
			case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
			case GETOPT_OPTION_TYPE_REQUIRED_INT32:
			case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
			case GETOPT_OPTION_TYPE_REQUIRED_FP32:
				return getopt_read_value(ctx, found_opt);
		}
	}
	/* no argument found */
	else
	{
		switch(found_opt->type)
		{
			case GETOPT_OPTION_TYPE_FLAG_SET: *found_opt->flag  = found_opt->value; return 0;
			case GETOPT_OPTION_TYPE_FLAG_AND: *found_opt->flag &= found_opt->value; return 0;
			case GETOPT_OPTION_TYPE_FLAG_OR:  *found_opt->flag |= found_opt->value; return 0; /* zero is "a flag was set!" */
			
			case GETOPT_OPTION_TYPE_NO_ARG:
			case GETOPT_OPTION_TYPE_OPTIONAL:
			case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
			case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
				return found_opt->value;

			/* the option requires an argument! (--option=arg, -o arg) */
			case GETOPT_OPTION_TYPE_REQUIRED:
			case GETOPT_OPTION_TYPE_REQUIRED_INT32:
			case GETOPT_OPTION_TYPE_REQUIRED_FP32:
				ctx->current_opt_arg = found_opt->name;
				return '!';
		}
	}

 	return -1;
}